

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::TextureCubeView::gatherCompare
          (TextureCubeView *this,Sampler *sampler,float ref,float s,float t,float r)

{
  CompareMode compare;
  bool isFixedPoint;
  undefined8 *in_RDX;
  int i;
  long lVar1;
  float extraout_XMM0_Da;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db_00;
  Vec4 VVar5;
  Vec4 gathered;
  Sampler noCompareSampler;
  TextureCubeView local_88;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 uVar4;
  
  local_88.m_levels[1] = (ConstPixelBufferAccess *)*in_RDX;
  local_88.m_levels[2] = (ConstPixelBufferAccess *)in_RDX[1];
  local_88.m_levels[3] = (ConstPixelBufferAccess *)in_RDX[2];
  local_88.m_levels[5] = (ConstPixelBufferAccess *)in_RDX[4];
  uStack_44 = *(undefined8 *)((long)in_RDX + 0x34);
  uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)in_RDX + 0x2c) >> 0x20);
  uStack_50 = (undefined4)in_RDX[5];
  local_4c = (undefined4)((ulong)in_RDX[5] >> 0x20);
  local_88.m_levels[4] = (ConstPixelBufferAccess *)(in_RDX[3] & 0xffffffff);
  VVar5 = gather(&local_88,sampler,s,t,r,(int)&local_88 + 0x10);
  uVar4 = VVar5.m_data._8_8_;
  isFixedPoint = isFixedPointDepthTextureFormat(*(TextureFormat **)&sampler->wrapR);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  compare = *(CompareMode *)((long)in_RDX + 0x1c);
  fVar2 = extraout_XMM0_Da;
  uVar3 = extraout_XMM0_Db;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = execCompare((Vec4 *)&local_88,compare,(int)lVar1,ref,isFixedPoint);
    *(float *)((long)this->m_levels + lVar1 * 4 + -8) = fVar2;
    uVar3 = extraout_XMM0_Db_00;
  }
  VVar5.m_data[1] = (float)uVar3;
  VVar5.m_data[0] = fVar2;
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 TextureCubeView::gatherCompare (const Sampler& sampler, float ref, float s, float t, float r) const
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(m_levels[0][0].getFormat().order == TextureFormat::D || m_levels[0][0].getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	Sampler noCompareSampler = sampler;
	noCompareSampler.compare = Sampler::COMPAREMODE_NONE;

	const Vec4 gathered			= gather(noCompareSampler, s, t, r, 0 /* component 0: depth */);
	const bool isFixedPoint		= isFixedPointDepthTextureFormat(m_levels[0][0].getFormat());
	Vec4 result;
	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}